

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O3

void __thiscall edition_unittest::Int32ParseTester::Clear(Int32ParseTester *this)

{
  RepeatedField<int> *pRVar1;
  ulong uVar2;
  int iVar3;
  bool bVar4;
  
  google::protobuf::internal::ExtensionSet::Clear(&(this->field_0)._impl_._extensions_);
  pRVar1 = &(this->field_0)._impl_.repeated_int32_lowfield_;
  uVar2 = *(ulong *)((long)&this->field_0 + 0x20);
  if ((uVar2 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar4 = (uVar2 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar4);
  iVar3 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar4);
  if ((iVar3 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar2 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.packed_int32_lowfield_;
  uVar2 = *(ulong *)((long)&this->field_0 + 0x38);
  if ((uVar2 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar4 = (uVar2 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar4);
  iVar3 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar4);
  if ((iVar3 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar2 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.repeated_int32_midfield_;
  uVar2 = *(ulong *)((long)&this->field_0 + 0x50);
  if ((uVar2 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar4 = (uVar2 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar4);
  iVar3 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar4);
  if ((iVar3 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar2 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.packed_int32_midfield_;
  uVar2 = *(ulong *)((long)&this->field_0 + 0x68);
  if ((uVar2 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar4 = (uVar2 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar4);
  iVar3 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar4);
  if ((iVar3 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar2 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.repeated_int32_hifield_;
  uVar2 = *(ulong *)((long)&this->field_0 + 0x80);
  if ((uVar2 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar4 = (uVar2 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar4);
  iVar3 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar4);
  if ((iVar3 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar2 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.packed_int32_hifield_;
  uVar2 = *(ulong *)((long)&this->field_0 + 0x98);
  if ((uVar2 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar4 = (uVar2 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar4);
  iVar3 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar4);
  if ((iVar3 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar2 & 4) == 0,0);
  if ((*(byte *)((long)&this->field_0 + 0x18) & 0xf) != 0) {
    *(undefined8 *)((long)&this->field_0 + 0xac) = 0;
    *(undefined8 *)((long)&this->field_0 + 0xb4) = 0;
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void Int32ParseTester::Clear() {
// @@protoc_insertion_point(message_clear_start:edition_unittest.Int32ParseTester)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_._extensions_.Clear();
  _impl_.repeated_int32_lowfield_.Clear();
  _impl_.packed_int32_lowfield_.Clear();
  _impl_.repeated_int32_midfield_.Clear();
  _impl_.packed_int32_midfield_.Clear();
  _impl_.repeated_int32_hifield_.Clear();
  _impl_.packed_int32_hifield_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    ::memset(&_impl_.optional_int32_lowfield_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.optional_int32_hifield_) -
        reinterpret_cast<char*>(&_impl_.optional_int32_lowfield_)) + sizeof(_impl_.optional_int32_hifield_));
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}